

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib541.c
# Opt level: O2

int test(char *URL)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  uint *puVar5;
  char *pcVar6;
  stat file_info;
  
  if (libtest_arg2 == (char *)0x0) {
    fwrite("Usage: <url> <file-to-upload>\n",0x1e,1,_stderr);
  }
  else {
    pFVar3 = fopen64(libtest_arg2,"rb");
    if (pFVar3 == (FILE *)0x0) {
      puVar5 = (uint *)__errno_location();
      pFVar3 = _stderr;
      uVar1 = *puVar5;
      pcVar6 = strerror(uVar1);
      fprintf(pFVar3,"fopen() failed with error: %d %s\n",(ulong)uVar1,pcVar6);
      fprintf(_stderr,"Error opening file: %s\n",libtest_arg2);
      return -2;
    }
    iVar2 = fileno(pFVar3);
    iVar2 = fstat64(iVar2,(stat64 *)&file_info);
    if (iVar2 != -1) {
      if (file_info.st_size == 0) {
        fprintf(_stderr,"ERROR: file %s has zero size!\n",libtest_arg2);
        fclose(pFVar3);
        return -4;
      }
      iVar2 = curl_global_init(3);
      if (iVar2 == 0) {
        lVar4 = curl_easy_init();
        if (lVar4 != 0) {
          iVar2 = curl_easy_setopt(lVar4,0x2e,1);
          if ((((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar4,0x29,1), iVar2 == 0)) &&
              (iVar2 = curl_easy_setopt(lVar4,0x2712,URL), iVar2 == 0)) &&
             (iVar2 = curl_easy_setopt(lVar4,0x2719,pFVar3), iVar2 == 0)) {
            curl_easy_perform(lVar4);
            iVar2 = curl_easy_perform(lVar4);
          }
          fclose(pFVar3);
          curl_easy_cleanup(lVar4);
          curl_global_cleanup();
          return iVar2;
        }
        fwrite("curl_easy_init() failed\n",0x18,1,_stderr);
        curl_global_cleanup();
      }
      else {
        fwrite("curl_global_init() failed\n",0x1a,1,_stderr);
      }
      fclose(pFVar3);
      return 0x7e;
    }
    puVar5 = (uint *)__errno_location();
    __stream = _stderr;
    uVar1 = *puVar5;
    pcVar6 = strerror(uVar1);
    fprintf(__stream,"fstat() failed with error: %d %s\n",(ulong)uVar1,pcVar6);
    fprintf(_stderr,"ERROR: cannot open file %s\n",libtest_arg2);
    fclose(pFVar3);
  }
  return -1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src ;
  int hd ;
  struct_stat file_info;
  int error;

  if (!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return -1;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return -2; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return -1;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return -4;
  }

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl,CURLOPT_URL, URL);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_INFILE, hd_src);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

  /* and now upload the exact same again, but without rewinding so it already
     is at end of file */
  res = curl_easy_perform(curl);

test_cleanup:

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}